

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O3

void __thiscall indigox::Molecule::Molecule(Molecule *this)

{
  _Rb_tree_header *p_Var1;
  MolecularGraph *this_00;
  ElectronOpt *this_01;
  
  utils::CountableObject<indigox::Molecule>::__id_generator_ =
       utils::CountableObject<indigox::Molecule>::__id_generator_ + 1;
  (this->super_CountableObject<indigox::Molecule>).id_ =
       utils::CountableObject<indigox::Molecule>::__id_generator_;
  (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
  super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
  super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->name_,"None","");
  this->q_ = 0;
  (this->atoms_).
  super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->atoms_).
  super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->atoms_).
  super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bonds_).
  super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bonds_).
  super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bonds_).
  super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->idx_to_atom_)._M_h._M_buckets = &(this->idx_to_atom_)._M_h._M_single_bucket;
  (this->idx_to_atom_)._M_h._M_bucket_count = 1;
  (this->idx_to_atom_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->idx_to_atom_)._M_h._M_element_count = 0;
  (this->idx_to_atom_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->idx_to_atom_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->idx_to_atom_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->idx_to_bond_)._M_h._M_buckets = &(this->idx_to_bond_)._M_h._M_single_bucket;
  (this->idx_to_bond_)._M_h._M_bucket_count = 1;
  (this->idx_to_bond_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->idx_to_bond_)._M_h._M_element_count = 0;
  (this->idx_to_bond_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->idx_to_bond_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->idx_to_bond_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->atom_to_vertex_)._M_t._M_impl.super__Rb_tree_header;
  (this->atom_to_vertex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->atom_to_vertex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->atom_to_vertex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->atom_to_vertex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->atom_to_vertex_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->bond_to_edge_)._M_t._M_impl.super__Rb_tree_header;
  (this->bond_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bond_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bond_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bond_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bond_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = (MolecularGraph *)operator_new(0xc0);
  MolecularGraph::MolecularGraph(this_00);
  (this->graph_).super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<indigox::MolecularGraph*>
            (&(this->graph_).super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  this_01 = (ElectronOpt *)operator_new(0x90);
  ElectronOpt::ElectronOpt(this_01);
  (this->elnopt_)._M_t.
  super___uniq_ptr_impl<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_>._M_t.
  super__Tuple_impl<0UL,_indigox::ElectronOpt_*,_std::default_delete<indigox::ElectronOpt>_>.
  super__Head_base<0UL,_indigox::ElectronOpt_*,_false>._M_head_impl = this_01;
  this->modified_ = true;
  return;
}

Assistant:

Molecule::Molecule()
: name_("None"), graph_(new MolecularGraph()), elnopt_(new ElectronOpt()){ }